

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

sunindextype SUNDlsMat_densePOTRF(sunrealtype **a,sunindextype m)

{
  double __x;
  long lVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  sunrealtype a_diag;
  sunrealtype *a_col_k;
  sunrealtype *a_col_j;
  double local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_40 = 0;
  while( true ) {
    if (in_RSI <= local_40) {
      return 0;
    }
    lVar1 = *(long *)(in_RDI + local_40 * 8);
    if (0 < local_40) {
      for (local_38 = local_40; local_38 < in_RSI; local_38 = local_38 + 1) {
        for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
          lVar2 = *(long *)(in_RDI + local_48 * 8);
          *(double *)(lVar1 + local_38 * 8) =
               -*(double *)(lVar2 + local_38 * 8) * *(double *)(lVar2 + local_40 * 8) +
               *(double *)(lVar1 + local_38 * 8);
        }
      }
    }
    __x = *(double *)(lVar1 + local_40 * 8);
    if (__x <= 0.0) break;
    if (0.0 < __x) {
      local_50 = sqrt(__x);
    }
    else {
      local_50 = 0.0;
    }
    for (local_38 = local_40; local_38 < in_RSI; local_38 = local_38 + 1) {
      *(double *)(lVar1 + local_38 * 8) = *(double *)(lVar1 + local_38 * 8) / local_50;
    }
    local_40 = local_40 + 1;
  }
  return local_40 + 1;
}

Assistant:

sunindextype SUNDlsMat_densePOTRF(sunrealtype** a, sunindextype m)
{
  sunrealtype *a_col_j, *a_col_k;
  sunrealtype a_diag;
  sunindextype i, j, k;

  for (j = 0; j < m; j++)
  {
    a_col_j = a[j];

    if (j > 0)
    {
      for (i = j; i < m; i++)
      {
        for (k = 0; k < j; k++)
        {
          a_col_k = a[k];
          a_col_j[i] -= a_col_k[i] * a_col_k[j];
        }
      }
    }

    a_diag = a_col_j[j];
    if (a_diag <= ZERO) { return (j + 1); }
    a_diag = SUNRsqrt(a_diag);

    for (i = j; i < m; i++) { a_col_j[i] /= a_diag; }
  }

  return (0);
}